

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O3

void __thiscall
Js::ConcatStringBuilder::ConcatStringBuilder(ConcatStringBuilder *this,ConcatStringBuilder *other)

{
  WriteBarrierPtr<Js::JavascriptString> *pWVar1;
  ConcatStringBuilder *pCVar2;
  Type TVar3;
  charcount_t newLength;
  StaticType *type;
  
  type = StringCache::GetStringTypeStatic
                   (&((((((((other->super_ConcatStringBase).super_LiteralString.
                            super_JavascriptString.super_RecyclableObject.type.ptr)->
                          javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                      super_ScriptContextBase).javascriptLibrary)->stringCache);
  LiteralString::LiteralString((LiteralString *)this,type);
  (this->super_ConcatStringBase).super_LiteralString.super_JavascriptString.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_014f2868;
  (this->m_slots).ptr = (WriteBarrierPtr<Js::JavascriptString> *)0x0;
  (this->m_prevChunk).ptr = (ConcatStringBuilder *)0x0;
  pWVar1 = (other->m_slots).ptr;
  Memory::Recycler::WBSetBit((char *)&this->m_slots);
  (this->m_slots).ptr = pWVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_slots);
  TVar3 = other->m_count;
  this->m_slotCount = other->m_slotCount;
  this->m_count = TVar3;
  pCVar2 = (other->m_prevChunk).ptr;
  Memory::Recycler::WBSetBit((char *)&this->m_prevChunk);
  (this->m_prevChunk).ptr = pCVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_prevChunk);
  newLength = JavascriptString::GetLength((JavascriptString *)other);
  JavascriptString::SetLength((JavascriptString *)this,newLength);
  return;
}

Assistant:

ConcatStringBuilder::ConcatStringBuilder(const ConcatStringBuilder& other):
        ConcatStringBase(other.GetScriptContext()->GetLibrary()->GetStringTypeStatic())
    {
        m_slots = other.m_slots;
        m_count = other.m_count;
        m_slotCount = other.m_slotCount;
        m_prevChunk = other.m_prevChunk;
        this->SetLength(other.GetLength());
        // TODO: should we copy the JavascriptString buffer and if so, how do we pass over the ownership?
    }